

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O3

void duckdb::ConstructPivots
               (PivotRef *ref,vector<duckdb::PivotValueElement,_true> *pivot_values,idx_t pivot_idx,
               PivotValueElement *current_value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  PivotValueElement *pPVar4;
  reference pvVar5;
  reference __x;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  _Alloc_hider _Var9;
  pointer this;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  PivotValueElement new_value;
  string local_f8;
  string local_d8;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  PivotRef *local_98;
  vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_> *local_90;
  idx_t local_88;
  PivotValueElement *local_80;
  idx_t local_78;
  pointer local_70;
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  char local_40 [16];
  
  local_98 = ref;
  local_90 = &pivot_values->
              super_vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>;
  local_88 = pivot_idx;
  local_80 = current_value;
  pvVar5 = vector<duckdb::PivotColumn,_true>::operator[](&ref->pivots,pivot_idx);
  this = (pvVar5->entries).
         super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
         super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
         _M_impl.super__Vector_impl_data._M_start;
  local_70 = (pvVar5->entries).
             super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
             super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (this != local_70) {
    local_88 = local_88 + 1;
    local_78 = ((long)(local_98->pivots).
                      super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                      super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(local_98->pivots).
                      super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                      super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    paVar1 = &local_f8.field_2;
    do {
      pPVar4 = local_80;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_68,
                 (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_80);
      local_50._M_p = local_40;
      pcVar2 = (pPVar4->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + (pPVar4->name)._M_string_length);
      local_b8 = local_a8;
      pcVar2 = (this->alias)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar2,pcVar2 + (this->alias)._M_string_length);
      if ((this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          __x = vector<duckdb::Value,_true>::operator[](&this->values,__n);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_68,__x);
          if ((this->alias)._M_string_length == 0) {
            if (local_b0 == 0) {
              Value::ToString_abi_cxx11_(&local_f8,__x);
              ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_f8);
              _Var9._M_p = local_f8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != paVar1) goto LAB_011e46ff;
            }
            else {
              Value::ToString_abi_cxx11_(&local_d8,__x);
              plVar6 = (long *)::std::__cxx11::string::replace
                                         ((ulong)&local_d8,0,(char *)0x0,0x1e09fa0);
              psVar8 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_f8.field_2._M_allocated_capacity = *psVar8;
                local_f8.field_2._8_8_ = plVar6[3];
                local_f8._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_f8.field_2._M_allocated_capacity = *psVar8;
                local_f8._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_f8._M_string_length = plVar6[1];
              *plVar6 = (long)psVar8;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != paVar1) {
                operator_delete(local_f8._M_dataplus._M_p);
              }
              _Var9._M_p = local_d8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
LAB_011e46ff:
                operator_delete(_Var9._M_p);
              }
            }
          }
          __n = __n + 1;
        } while (__n < (ulong)((long)(this->values).
                                     super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->values).
                                     super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 6));
      }
      sVar3 = (local_80->name)._M_string_length;
      if (sVar3 == 0) {
        ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b8);
      }
      else {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        pcVar2 = (local_80->name)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>((string *)&local_d8,pcVar2,pcVar2 + sVar3);
        ::std::__cxx11::string::append((char *)&local_d8);
        puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8);
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_f8.field_2._M_allocated_capacity = *psVar8;
          local_f8.field_2._8_8_ = puVar7[3];
          local_f8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar8;
          local_f8._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_f8._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
      }
      if (local_88 == local_78) {
        ::std::vector<duckdb::PivotValueElement,_std::allocator<duckdb::PivotValueElement>_>::
        emplace_back<duckdb::PivotValueElement>(local_90,(PivotValueElement *)local_68);
      }
      else {
        ConstructPivots(local_98,(vector<duckdb::PivotValueElement,_true> *)local_90,local_88,
                        (PivotValueElement *)local_68);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8);
      }
      if (local_50._M_p != local_40) {
        operator_delete(local_50._M_p);
      }
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_68);
      this = this + 1;
    } while (this != local_70);
  }
  return;
}

Assistant:

static void ConstructPivots(PivotRef &ref, vector<PivotValueElement> &pivot_values, idx_t pivot_idx = 0,
                            const PivotValueElement &current_value = PivotValueElement()) {
	auto &pivot = ref.pivots[pivot_idx];
	bool last_pivot = pivot_idx + 1 == ref.pivots.size();
	for (auto &entry : pivot.entries) {
		PivotValueElement new_value = current_value;
		string name = entry.alias;
		D_ASSERT(entry.values.size() == pivot.pivot_expressions.size());
		for (idx_t v = 0; v < entry.values.size(); v++) {
			auto &value = entry.values[v];
			new_value.values.push_back(value);
			if (entry.alias.empty()) {
				if (name.empty()) {
					name = value.ToString();
				} else {
					name += "_" + value.ToString();
				}
			}
		}
		if (!current_value.name.empty()) {
			new_value.name = current_value.name + "_" + name;
		} else {
			new_value.name = std::move(name);
		}
		if (last_pivot) {
			pivot_values.push_back(std::move(new_value));
		} else {
			// need to recurse
			ConstructPivots(ref, pivot_values, pivot_idx + 1, new_value);
		}
	}
}